

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  char *__s;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".protodevel",&local_41);
  bVar1 = HasSuffixString(filename,&local_40);
  __s = ".proto";
  if (bVar1) {
    __s = ".protodevel";
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  StripSuffixString(__return_storage_ptr__,filename,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  const char* suffix = HasSuffixString(filename, ".protodevel")
      ? ".protodevel" : ".proto";
  return StripSuffixString(filename, suffix);
}